

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O0

bool EV_TeleportOther(int other_tid,int dest_tid,bool fog)

{
  bool bVar1;
  int flags;
  bool bVar2;
  undefined1 local_30 [8];
  FActorIterator iterator;
  AActor *victim;
  bool didSomething;
  bool fog_local;
  int dest_tid_local;
  int other_tid_local;
  
  bVar2 = false;
  if ((other_tid != 0) && (dest_tid != 0)) {
    FActorIterator::FActorIterator((FActorIterator *)local_30,other_tid);
    while (iterator._8_8_ = FActorIterator::Next((FActorIterator *)local_30),
          (AActor *)iterator._8_8_ != (AActor *)0x0) {
      flags = 4;
      if (fog) {
        flags = 3;
      }
      bVar1 = EV_Teleport(dest_tid,0,(line_t_conflict *)0x0,0,(AActor *)iterator._8_8_,flags);
      bVar2 = bVar2 != false || bVar1;
    }
  }
  return bVar2;
}

Assistant:

bool EV_TeleportOther (int other_tid, int dest_tid, bool fog)
{
	bool didSomething = false;

	if (other_tid != 0 && dest_tid != 0)
	{
		AActor *victim;
		FActorIterator iterator (other_tid);

		while ( (victim = iterator.Next ()) )
		{
			didSomething |= EV_Teleport (dest_tid, 0, NULL, 0, victim,
				fog ? (TELF_DESTFOG | TELF_SOURCEFOG) : TELF_KEEPORIENTATION);
		}
	}

	return didSomething;
}